

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O0

void __thiscall
nodecpp::platform::internal_msg::InternalMsg::appendUint8(InternalMsg *this,uint8_t what)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  EVP_PKEY_CTX *ctx;
  anon_class_8_1_8991fb9c local_40;
  anon_class_8_1_8e8574ca local_38;
  size_t local_30;
  size_t remainingInPage;
  anon_class_8_1_8991fb9c local_20;
  uint8_t local_11;
  InternalMsg *pIStack_10;
  uint8_t what_local;
  InternalMsg *this_local;
  
  local_11 = what;
  pIStack_10 = this;
  puVar2 = PagePtrWrapper::page(&this->currentPage);
  if (puVar2 == (uint8_t *)0x0) {
    if (this->totalSz == 0) {
      local_20.this = this;
      assert::
      nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::appendUint8(unsigned_char)::_lambda()_1_>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0x213,&local_20,"currentPage.page() == nullptr");
      reserveSpaceForConvertionToTag(this);
    }
    else {
      implAddPage(this);
    }
    remainingInPage = (size_t)this;
    assert::
    nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::appendUint8(unsigned_char)::_lambda()_2_>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
               ,0x216,(anon_class_8_1_8991fb9c *)&remainingInPage,"currentPage.page() != nullptr");
  }
  local_30 = remainingSizeInCurrentPage(this);
  local_38.remainingInPage = &local_30;
  assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::appendUint8(unsigned_char)::_lambda()_3_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
             ,0x219,&local_38,"remainingInPage != 0");
  uVar1 = local_11;
  puVar2 = PagePtrWrapper::page(&this->currentPage);
  sVar3 = offsetInCurrentPage(this);
  puVar2[sVar3] = uVar1;
  this->totalSz = this->totalSz + 1;
  if (local_30 == 1) {
    ctx = (EVP_PKEY_CTX *)0x21e;
    local_40.this = this;
    assert::
    nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::appendUint8(unsigned_char)::_lambda()_4_>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
               ,0x21e,&local_40,"offsetInCurrentPage() == 0");
    PagePtrWrapper::init(&this->currentPage,ctx);
  }
  return;
}

Assistant:

void appendUint8( uint8_t what )
		{
			if ( currentPage.page() == nullptr )
			{
				if ( totalSz )
					implAddPage();
				else
				{
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() == nullptr );
					reserveSpaceForConvertionToTag();
				}
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() != nullptr );
			}
			size_t remainingInPage = remainingSizeInCurrentPage();
			NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, remainingInPage != 0 );
			*(currentPage.page() + offsetInCurrentPage()) = what;
			++totalSz;
			if( 1 == remainingInPage )
			{
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
				currentPage.init();
			}
		}